

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

string_t * __thiscall
pugi::xml_node::path_abi_cxx11_(string_t *__return_storage_ptr__,xml_node *this,char_t delimiter)

{
  char_t *pcVar1;
  unspecified_bool_type p_Var2;
  allocator<char> local_71;
  string local_70 [8];
  string_t temp;
  xml_node local_48 [3];
  allocator<char> local_2a;
  undefined1 local_29;
  xml_node local_28;
  xml_node cursor;
  char_t delimiter_local;
  xml_node *this_local;
  string_t *result;
  
  local_28 = (xml_node)this->_root;
  local_29 = 0;
  cursor._root._7_1_ = delimiter;
  pcVar1 = name(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar1,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  while( true ) {
    local_48[0] = parent(&local_28);
    p_Var2 = operator_cast_to_function_pointer(local_48);
    if (p_Var2 == (unspecified_bool_type)0x0) break;
    temp.field_2._8_8_ = parent(&local_28);
    local_28 = (xml_node)temp.field_2._8_8_;
    pcVar1 = name(&local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,pcVar1,&local_71);
    std::allocator<char>::~allocator(&local_71);
    std::__cxx11::string::operator+=(local_70,cursor._root._7_1_);
    std::__cxx11::string::operator+=(local_70,(string *)__return_storage_ptr__);
    std::__cxx11::string::swap((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		xml_node cursor = *this; // Make a copy.
		
		string_t result = cursor.name();

		while (cursor.parent())
		{
			cursor = cursor.parent();
			
			string_t temp = cursor.name();
			temp += delimiter;
			temp += result;
			result.swap(temp);
		}

		return result;
	}